

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O1

int arkInterpEvaluate_Hermite
              (ARKodeMem_conflict ark_mem,ARKInterp interp,sunrealtype tau,int d,int order,
              N_Vector yout)

{
  uint uVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  N_Vector p_Var9;
  undefined8 uVar10;
  char *msgfmt;
  int iVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 local_128 [16];
  double dStack_118;
  double dStack_110;
  double dStack_108;
  double local_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  sunrealtype local_d8;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double local_88;
  double local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  N_Vector local_60;
  N_Vector p_Stack_58;
  N_Vector local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  dVar24 = *(double *)((long)interp->content + 0x38);
  uVar12 = 0;
  if (0 < order) {
    uVar12 = order;
  }
  uVar1 = *interp->content;
  if ((int)uVar1 <= (int)uVar12) {
    uVar12 = uVar1;
  }
  uVar10 = 0;
  if (ark_mem->fn_is_current == 0) {
    uStack_f0 = 0;
    local_f8 = dVar24;
    local_d8 = tau;
    iVar8 = (*ark_mem->step_fullrhs)(ark_mem,ark_mem->tn,ark_mem->yn,ark_mem->fn,1);
    if (iVar8 != 0) {
      return -8;
    }
    ark_mem->fn_is_current = 1;
    dVar24 = local_f8;
    uVar10 = uStack_f0;
    tau = local_d8;
  }
  if (d < 0) {
    msgfmt = "Requested illegal derivative.";
    iVar8 = 0x1e0;
LAB_0013bd68:
    arkProcessError(ark_mem,-0x16,iVar8,"arkInterpEvaluate_Hermite",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_interp.c"
                    ,msgfmt);
    return -0x16;
  }
  if ((int)uVar12 < d) {
    N_VConst(0,yout);
    goto LAB_0013c4dc;
  }
  if (5 < uVar12) {
    msgfmt = "Illegal polynomial order";
    iVar8 = 0x307;
    goto LAB_0013bd68;
  }
  dVar35 = tau * tau;
  dVar36 = dVar35 * tau;
  auVar37._0_8_ = dVar24 * dVar24;
  dVar38 = dVar24 * auVar37._0_8_;
  switch(uVar12) {
  case 0:
    uVar10 = *(undefined8 *)((long)interp->content + 0x10);
    p_Var9 = ark_mem->yn;
    dVar35 = 0.5;
    dVar24 = 0.5;
    goto LAB_0013c332;
  case 1:
    if (d == 0) {
      dVar35 = -tau;
      dVar24 = tau + 1.0;
    }
    else {
      dVar35 = -1.0 / dVar24;
      dVar24 = 1.0 / dVar24;
    }
    uVar10 = *(undefined8 *)((long)interp->content + 0x10);
    p_Var9 = ark_mem->yn;
LAB_0013c332:
    N_VLinearSum(dVar35,dVar24,uVar10,p_Var9,yout);
    goto LAB_0013c4dc;
  case 2:
    if (d == 1) {
      auVar13._0_8_ = tau * 2.0;
      auVar13._8_8_ = tau * -2.0;
      auVar6._8_8_ = dVar24;
      auVar6._0_8_ = dVar24;
      local_128 = divpd(auVar13,auVar6);
      dStack_118 = tau + tau + 1.0;
    }
    else if (d == 0) {
      local_128._8_8_ = 1.0 - dVar35;
      local_128._0_8_ = dVar35;
      dStack_118 = (tau + dVar35) * dVar24;
    }
    else {
      auVar4._8_8_ = dVar24;
      auVar4._0_8_ = dVar24;
      auVar37 = divpd(_DAT_0017d410,auVar4);
      dStack_118 = auVar37._0_8_;
      auVar5._8_8_ = dVar24;
      auVar5._0_8_ = dVar24;
      local_128 = divpd(auVar37,auVar5);
    }
    local_68 = *(undefined8 *)((long)interp->content + 0x10);
    local_60 = ark_mem->yn;
    p_Stack_58 = ark_mem->fn;
    uVar10 = 3;
    break;
  case 3:
    if (d == 2) {
      dVar35 = tau + tau + 1.0;
      auVar15._0_8_ = dVar35 * 6.0;
      auVar15._8_8_ = dVar35 * -6.0;
      auVar37._8_8_ = auVar37._0_8_;
      local_128 = divpd(auVar15,auVar37);
      dStack_118 = (tau * 6.0 + 2.0) / dVar24;
      dStack_110 = (tau * 6.0 + 4.0) / dVar24;
    }
    else if (d == 1) {
      auVar14._0_8_ = (dVar35 + tau) * 6.0;
      auVar14._8_8_ = (dVar35 + tau) * -6.0;
      auVar3._8_8_ = dVar24;
      auVar3._0_8_ = dVar24;
      local_128 = divpd(auVar14,auVar3);
      dStack_118 = tau + tau + dVar35 * 3.0;
      dStack_110 = dVar35 * 3.0 + tau * 4.0 + 1.0;
    }
    else if (d == 0) {
      local_128._8_8_ = dVar36 * -2.0 + dVar35 * -3.0 + 1.0;
      local_128._0_8_ = dVar35 * 3.0 + dVar36 + dVar36;
      dStack_110 = (dVar35 + dVar35 + tau + dVar36) * dVar24;
      dStack_118 = (dVar35 + dVar36) * dVar24;
    }
    else {
      auVar7._8_8_ = dVar38;
      auVar7._0_8_ = dVar38;
      local_128 = divpd(_DAT_0017d400,auVar7);
      dStack_110 = 6.0 / auVar37._0_8_;
      dStack_118 = dStack_110;
    }
    local_68 = *(undefined8 *)((long)interp->content + 0x10);
    local_60 = ark_mem->yn;
    p_Stack_58 = *(N_Vector *)((long)interp->content + 8);
    local_50 = ark_mem->fn;
    uVar10 = 4;
    break;
  case 4:
    local_f8 = dVar24;
    uStack_f0 = uVar10;
    local_e8 = dVar35;
    local_d8 = tau;
    local_c8 = auVar37._0_8_;
    uStack_c0 = uVar10;
    local_b8 = dVar38;
    uStack_b0 = uVar10;
    local_a8 = dVar24 * dVar38;
    uStack_a0 = uVar10;
    local_98 = dVar36 * tau;
    local_88 = dVar36;
    iVar8 = (*interp->ops->evaluate)(ark_mem,interp,-0.3333333333333333,0,3,yout);
    if (iVar8 != 0) {
      return -8;
    }
    iVar8 = (*ark_mem->step_fullrhs)
                      (ark_mem,local_f8 / -3.0 + *(double *)((long)interp->content + 0x30),yout,
                       *(N_Vector *)((long)interp->content + 0x18),2);
    if (iVar8 != 0) {
      return -8;
    }
    switch(d) {
    case 0:
      local_128._8_8_ = local_98 * 9.0 + local_88 * 16.0 + local_e8 * 6.0 + 1.0;
      local_128._0_8_ = local_98 * -9.0 + local_e8 * -6.0 + local_88 * -16.0;
      dStack_118 = (local_98 * -9.0 + local_e8 * -5.0 + local_88 * -14.0) * local_f8 * 0.25;
      dStack_110 = local_f8 * (local_e8 + local_e8 + local_d8 + local_88);
      dStack_108 = ((local_88 * -2.0 - local_98) - local_e8) * local_f8 * 27.0 * 0.25;
      break;
    case 1:
      auVar20._0_8_ = local_88 * -36.0 + local_d8 * -12.0 + -(local_e8 * 48.0);
      auVar20._8_8_ = local_88 * 36.0 + local_d8 * 12.0 + local_e8 * 48.0;
      auVar29._8_8_ = local_f8;
      auVar29._0_8_ = local_f8;
      local_128 = divpd(auVar20,auVar29);
      dStack_118 = (local_88 * -18.0 + local_d8 * -5.0 + local_e8 * -21.0) * 0.5;
      dStack_110 = local_d8 * 4.0 + 1.0 + local_e8 * 3.0;
      dStack_108 = (local_88 + local_88 + local_e8 * 3.0 + local_d8) * -13.5;
      break;
    case 2:
      auVar25._0_8_ = local_e8 * -108.0 + local_d8 * -96.0 + -12.0;
      auVar25._8_8_ = local_e8 * 108.0 + local_d8 * 96.0 + 12.0;
      auVar16._8_8_ = local_c8;
      auVar16._0_8_ = local_c8;
      local_128 = divpd(auVar25,auVar16);
      auVar26._0_8_ = local_e8 * -27.0 + local_d8 * -21.0 + -2.5;
      auVar26._8_8_ = local_d8 * 6.0 + 4.0;
      auVar17._8_8_ = local_f8;
      auVar17._0_8_ = local_f8;
      auVar37 = divpd(auVar26,auVar17);
      dStack_118 = auVar37._0_8_;
      dStack_110 = auVar37._8_8_;
      dStack_108 = (local_e8 * -81.0 + local_d8 * -81.0 + -13.5) / local_f8;
      break;
    case 3:
      auVar18._0_8_ = local_d8 * -216.0 + -96.0;
      auVar18._8_8_ = local_d8 * 216.0 + 96.0;
      auVar27._8_8_ = local_b8;
      auVar27._0_8_ = local_b8;
      local_128 = divpd(auVar18,auVar27);
      auVar19._0_8_ = local_d8 * -54.0 + -21.0;
      auVar19._8_8_ = 0x4018000000000000;
      auVar28._8_8_ = local_c8;
      auVar28._0_8_ = local_c8;
      auVar37 = divpd(auVar19,auVar28);
      dStack_118 = auVar37._0_8_;
      dStack_110 = auVar37._8_8_;
      dStack_108 = (local_d8 * -162.0 + -81.0) / local_c8;
      break;
    default:
      auVar30._8_8_ = local_a8;
      auVar30._0_8_ = local_a8;
      local_128 = divpd(_DAT_0017d340,auVar30);
      dStack_118 = -54.0 / local_b8;
      dStack_110 = 0.0;
      dStack_108 = -162.0 / local_b8;
    }
    pvVar2 = interp->content;
    local_68 = *(undefined8 *)((long)pvVar2 + 0x10);
    local_60 = ark_mem->yn;
    p_Stack_58 = *(N_Vector *)((long)pvVar2 + 8);
    local_50 = ark_mem->fn;
    local_48 = *(undefined8 *)((long)pvVar2 + 0x18);
    uVar10 = 5;
    break;
  case 5:
    local_f8 = dVar24;
    uStack_f0 = uVar10;
    local_e8 = dVar35;
    local_d8 = tau;
    local_c8 = auVar37._0_8_;
    uStack_c0 = uVar10;
    local_b8 = dVar38;
    uStack_b0 = uVar10;
    local_a8 = dVar24 * dVar38;
    uStack_a0 = uVar10;
    local_98 = dVar36 * tau;
    local_88 = dVar36;
    iVar8 = (*interp->ops->evaluate)(ark_mem,interp,-0.3333333333333333,0,4,yout);
    if (iVar8 != 0) {
      return -8;
    }
    iVar8 = (*ark_mem->step_fullrhs)
                      (ark_mem,local_f8 / -3.0 + *(double *)((long)interp->content + 0x30),yout,
                       *(N_Vector *)((long)interp->content + 0x18),2);
    if (iVar8 != 0) {
      return -8;
    }
    iVar8 = (*interp->ops->evaluate)(ark_mem,interp,-0.6666666666666666,0,4,yout);
    if (iVar8 != 0) {
      return -8;
    }
    local_78 = local_f8 + local_f8;
    uStack_70 = uStack_f0;
    iVar8 = (*ark_mem->step_fullrhs)
                      (ark_mem,local_78 / -3.0 + *(double *)((long)interp->content + 0x30),yout,
                       *(N_Vector *)((long)interp->content + 0x20),2);
    if (iVar8 != 0) {
      return -8;
    }
    switch(d) {
    case 0:
      dVar24 = local_98 * local_d8;
      local_100 = local_f8 * 0.25;
      local_128._0_8_ = local_e8 * 30.0 + local_88 * 110.0 + dVar24 * 54.0 + local_98 * 135.0;
      dStack_118 = local_100 * (local_e8 * 13.0 + local_88 * 49.0 + dVar24 * 27.0 + local_98 * 63.0)
      ;
      local_128._8_8_ = 1.0 - (double)local_128._0_8_;
      dStack_110 = local_100 *
                   (local_d8 * 4.0 +
                   local_e8 * 26.0 + local_88 * 67.0 + dVar24 * 27.0 + local_98 * 72.0);
      dStack_108 = local_100 *
                   (local_e8 * 27.0 + local_88 * 135.0 + dVar24 * 81.0 + local_98 * 189.0);
      local_100 = (local_e8 * 54.0 + local_88 * 189.0 + dVar24 * 81.0 + local_98 * 216.0) *
                  local_100;
      break;
    case 1:
      local_128._0_8_ =
           (local_d8 * 60.0 + local_e8 * 330.0 + local_98 * 270.0 + local_88 * 540.0) / local_f8;
      local_128._8_8_ = -(double)local_128._0_8_;
      dStack_118 = (local_d8 * 26.0 + local_e8 * 147.0 + local_88 * 252.0 + local_98 * 135.0) * 0.25
      ;
      dStack_110 = (local_d8 * 52.0 + local_e8 * 201.0 + local_88 * 288.0 + local_98 * 135.0 + 4.0)
                   * 0.25;
      dStack_108 = (local_d8 * 54.0 + local_e8 * 405.0 + local_88 * 756.0 + local_98 * 405.0) * 0.25
      ;
      local_100 = (local_d8 * 108.0 + local_e8 * 567.0 + local_88 * 864.0 + local_98 * 405.0) * 0.25
      ;
      break;
    case 2:
      local_128._0_8_ = (local_d8 * 660.0 + local_88 * 1080.0 + local_e8 * 1620.0 + 60.0) / local_c8
      ;
      local_128._8_8_ = -(double)local_128._0_8_;
      auVar22._0_8_ = local_d8 * 147.0 + local_88 * 270.0 + local_e8 * 378.0 + 13.0;
      auVar22._8_8_ = local_d8 * 201.0 + local_88 * 270.0 + local_e8 * 432.0 + 26.0;
      auVar32._8_8_ = local_78;
      auVar32._0_8_ = local_78;
      auVar37 = divpd(auVar22,auVar32);
      dStack_118 = auVar37._0_8_;
      dStack_110 = auVar37._8_8_;
      dStack_108 = (local_d8 * 405.0 + local_e8 * 1134.0 + local_88 * 810.0 + 27.0) / local_78;
      local_100 = local_d8 * 567.0 + local_e8 * 1296.0 + local_88 * 810.0 + 54.0;
      dVar24 = local_78;
      goto LAB_0013c9fd;
    case 3:
      local_128._0_8_ = (local_e8 * 3240.0 + local_d8 * 3240.0 + 660.0) / local_b8;
      local_128._8_8_ = -(double)local_128._0_8_;
      dVar24 = local_c8 + local_c8;
      auVar23._0_8_ = local_e8 * 810.0 + local_d8 * 756.0 + 147.0;
      auVar23._8_8_ = local_e8 * 810.0 + local_d8 * 864.0 + 201.0;
      auVar33._8_8_ = dVar24;
      auVar33._0_8_ = dVar24;
      auVar37 = divpd(auVar23,auVar33);
      dStack_118 = auVar37._0_8_;
      dStack_110 = auVar37._8_8_;
      dStack_108 = (local_d8 * 2268.0 + local_e8 * 2430.0 + 405.0) / dVar24;
      local_100 = local_d8 * 2592.0 + local_e8 * 2430.0 + 567.0;
LAB_0013c9fd:
      local_100 = local_100 / dVar24;
      break;
    case 4:
      local_128._0_8_ = (local_d8 * 6480.0 + 3240.0) / local_a8;
      local_128._8_8_ = -(double)local_128._0_8_;
      auVar21._0_8_ = local_d8 * 810.0 + 378.0;
      auVar21._8_8_ = local_d8 * 810.0 + 432.0;
      auVar31._8_8_ = local_b8;
      auVar31._0_8_ = local_b8;
      auVar37 = divpd(auVar21,auVar31);
      dStack_118 = auVar37._0_8_;
      dStack_110 = auVar37._8_8_;
      dStack_108 = (local_d8 * 2430.0 + 1134.0) / local_b8;
      local_100 = (local_d8 * 2430.0 + 1296.0) / local_b8;
      break;
    default:
      local_128._0_8_ = 6480.0 / (local_f8 * local_a8);
      auVar34._8_8_ = local_a8;
      auVar34._0_8_ = local_a8;
      auVar37 = divpd(_DAT_0017d330,auVar34);
      dStack_118 = auVar37._0_8_;
      local_128._8_8_ = -(double)local_128._0_8_;
      dStack_108 = auVar37._8_8_;
      local_100 = dStack_108;
      dStack_110 = dStack_118;
    }
    pvVar2 = interp->content;
    local_68 = *(undefined8 *)((long)pvVar2 + 0x10);
    local_60 = ark_mem->yn;
    p_Stack_58 = *(N_Vector *)((long)pvVar2 + 8);
    local_50 = ark_mem->fn;
    local_48 = *(undefined8 *)((long)pvVar2 + 0x18);
    local_40 = *(undefined8 *)((long)pvVar2 + 0x20);
    uVar10 = 6;
  }
  iVar8 = N_VLinearCombination(uVar10,local_128,&local_68,yout);
  iVar11 = -0x1c;
  if (iVar8 == 0) {
LAB_0013c4dc:
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int arkInterpEvaluate_Hermite(ARKodeMem ark_mem, ARKInterp interp,
                              sunrealtype tau, int d, int order, N_Vector yout)
{
  /* local variables */
  int q, retval;
  sunrealtype tval, a0, a1, tau2, tau3, tau4, tau5;
  sunrealtype h, h2, h3, h4, h5;
  sunrealtype a[6];
  N_Vector X[6];

  /* set constants */
  tau2 = tau * tau;
  tau3 = tau * tau2;
  tau4 = tau * tau3;
  tau5 = tau * tau4;

  h  = HINT_H(interp);
  h2 = h * h;
  h3 = h * h2;
  h4 = h * h3;
  h5 = h * h4;

  /* determine polynomial order q */
  q = SUNMAX(order, 0);               /* respect lower bound  */
  q = SUNMIN(q, HINT_DEGREE(interp)); /* respect max possible */

  SUNLogDebug(ARK_LOGGER, "interp-eval",
              "tau = " SUN_FORMAT_G ", d = %i, q = %i", tau, d, q);

  /* call full RHS if needed -- called just AFTER the end of a step, so yn has
     been updated to ycur */
  if (!(ark_mem->fn_is_current))
  {
    retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tn, ark_mem->yn,
                                   ark_mem->fn, ARK_FULLRHS_END);
    if (retval) { return ARK_RHSFUNC_FAIL; }
    ark_mem->fn_is_current = SUNTRUE;
  }

  /* error on illegal d */
  if (d < 0)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Requested illegal derivative.");
    return (ARK_ILL_INPUT);
  }

  /* if d is too high, just return zeros */
  if (d > q)
  {
    N_VConst(ZERO, yout);
    return (ARK_SUCCESS);
  }

  /* build polynomial based on order */
  switch (q)
  {
  case (0): /* constant interpolant, yout = 0.5*(yn+yp) */
    N_VLinearSum(HALF, HINT_YOLD(interp), HALF, ark_mem->yn, yout);
    break;

  case (1): /* linear interpolant */
    if (d == 0)
    {
      a0 = -tau;
      a1 = ONE + tau;
    }
    else
    { /* d=1 */
      a0 = -ONE / h;
      a1 = ONE / h;
    }
    N_VLinearSum(a0, HINT_YOLD(interp), a1, ark_mem->yn, yout);
    break;

  case (2): /* quadratic interpolant */
    if (d == 0)
    {
      a[0] = tau2;
      a[1] = ONE - tau2;
      a[2] = h * (tau2 + tau);
    }
    else if (d == 1)
    {
      a[0] = TWO * tau / h;
      a[1] = -TWO * tau / h;
      a[2] = (ONE + TWO * tau);
    }
    else
    { /* d == 2 */
      a[0] = TWO / h / h;
      a[1] = -TWO / h / h;
      a[2] = TWO / h;
    }
    X[0]   = HINT_YOLD(interp);
    X[1]   = ark_mem->yn;
    X[2]   = ark_mem->fn;
    retval = N_VLinearCombination(3, a, X, yout);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
    break;

  case (3): /* cubic interpolant */
    if (d == 0)
    {
      a[0] = THREE * tau2 + TWO * tau3;
      a[1] = ONE - THREE * tau2 - TWO * tau3;
      a[2] = h * (tau2 + tau3);
      a[3] = h * (tau + TWO * tau2 + tau3);
    }
    else if (d == 1)
    {
      a[0] = SIX * (tau + tau2) / h;
      a[1] = -SIX * (tau + tau2) / h;
      a[2] = TWO * tau + THREE * tau2;
      a[3] = ONE + FOUR * tau + THREE * tau2;
    }
    else if (d == 2)
    {
      a[0] = SIX * (ONE + TWO * tau) / h2;
      a[1] = -SIX * (ONE + TWO * tau) / h2;
      a[2] = (TWO + SIX * tau) / h;
      a[3] = (FOUR + SIX * tau) / h;
    }
    else
    { /* d == 3 */
      a[0] = TWELVE / h3;
      a[1] = -TWELVE / h3;
      a[2] = SIX / h2;
      a[3] = SIX / h2;
    }
    X[0]   = HINT_YOLD(interp);
    X[1]   = ark_mem->yn;
    X[2]   = HINT_FOLD(interp);
    X[3]   = ark_mem->fn;
    retval = N_VLinearCombination(4, a, X, yout);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
    break;

  case (4): /* quartic interpolant */

    /* first, evaluate cubic interpolant at tau=-1/3 */
    tval   = -ONE / THREE;
    retval = arkInterpEvaluate(ark_mem, interp, tval, 0, 3, yout);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* second, evaluate RHS at tau=-1/3, storing the result in fa */
    tval   = HINT_TNEW(interp) - h / THREE;
    retval = ark_mem->step_fullrhs(ark_mem, tval, yout, HINT_FA(interp),
                                   ARK_FULLRHS_OTHER);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* evaluate desired function */
    if (d == 0)
    {
      a[0] = -SIX * tau2 - SUN_RCONST(16.0) * tau3 - SUN_RCONST(9.0) * tau4;
      a[1] = ONE + SIX * tau2 + SUN_RCONST(16.0) * tau3 + SUN_RCONST(9.0) * tau4;
      a[2] = h * FOURTH *
             (-FIVE * tau2 - SUN_RCONST(14.0) * tau3 - SUN_RCONST(9.0) * tau4);
      a[3] = h * (tau + TWO * tau2 + tau3);
      a[4] = h * SUN_RCONST(27.0) * FOURTH * (-tau4 - TWO * tau3 - tau2);
    }
    else if (d == 1)
    {
      a[0] =
        (-TWELVE * tau - SUN_RCONST(48.0) * tau2 - SUN_RCONST(36.0) * tau3) / h;
      a[1] = (TWELVE * tau + SUN_RCONST(48.0) * tau2 + SUN_RCONST(36.0) * tau3) /
             h;
      a[2] = HALF *
             (-FIVE * tau - SUN_RCONST(21.0) * tau2 - SUN_RCONST(18.0) * tau3);
      a[3] = (ONE + FOUR * tau + THREE * tau2);
      a[4] = -SUN_RCONST(27.0) * HALF * (TWO * tau3 + THREE * tau2 + tau);
    }
    else if (d == 2)
    {
      a[0] = (-TWELVE - SUN_RCONST(96.0) * tau - SUN_RCONST(108.0) * tau2) / h2;
      a[1] = (TWELVE + SUN_RCONST(96.0) * tau + SUN_RCONST(108.0) * tau2) / h2;
      a[2] = (-FIVE * HALF - SUN_RCONST(21.0) * tau - SUN_RCONST(27.0) * tau2) /
             h;
      a[3] = (FOUR + SIX * tau) / h;
      a[4] = (-SUN_RCONST(27.0) * HALF - SUN_RCONST(81.0) * tau -
              SUN_RCONST(81.0) * tau2) /
             h;
    }
    else if (d == 3)
    {
      a[0] = (-SUN_RCONST(96.0) - SUN_RCONST(216.0) * tau) / h3;
      a[1] = (SUN_RCONST(96.0) + SUN_RCONST(216.0) * tau) / h3;
      a[2] = (-SUN_RCONST(21.0) - SUN_RCONST(54.0) * tau) / h2;
      a[3] = SIX / h2;
      a[4] = (-SUN_RCONST(81.0) - SUN_RCONST(162.0) * tau) / h2;
    }
    else
    { /* d == 4 */
      a[0] = -SUN_RCONST(216.0) / h4;
      a[1] = SUN_RCONST(216.0) / h4;
      a[2] = -SUN_RCONST(54.0) / h3;
      a[3] = ZERO;
      a[4] = -SUN_RCONST(162.0) / h3;
    }
    X[0]   = HINT_YOLD(interp);
    X[1]   = ark_mem->yn;
    X[2]   = HINT_FOLD(interp);
    X[3]   = ark_mem->fn;
    X[4]   = HINT_FA(interp);
    retval = N_VLinearCombination(5, a, X, yout);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
    break;

  case (5): /* quintic interpolant */

    /* first, evaluate quartic interpolant at tau=-1/3 */
    tval   = -ONE / THREE;
    retval = arkInterpEvaluate(ark_mem, interp, tval, 0, 4, yout);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* second, evaluate RHS at tau=-1/3, storing the result in fa */
    tval   = HINT_TNEW(interp) - h / THREE;
    retval = ark_mem->step_fullrhs(ark_mem, tval, yout, HINT_FA(interp),
                                   ARK_FULLRHS_OTHER);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* third, evaluate quartic interpolant at tau=-2/3 */
    tval   = -TWO / THREE;
    retval = arkInterpEvaluate(ark_mem, interp, tval, 0, 4, yout);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* fourth, evaluate RHS at tau=-2/3, storing the result in fb */
    tval   = HINT_TNEW(interp) - h * TWO / THREE;
    retval = ark_mem->step_fullrhs(ark_mem, tval, yout, HINT_FB(interp),
                                   ARK_FULLRHS_OTHER);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* evaluate desired function */
    if (d == 0)
    {
      a[0] = SUN_RCONST(54.0) * tau5 + SUN_RCONST(135.0) * tau4 +
             SUN_RCONST(110.0) * tau3 + SUN_RCONST(30.0) * tau2;
      a[1] = ONE - a[0];
      a[2] = h / FOUR *
             (SUN_RCONST(27.0) * tau5 + SUN_RCONST(63.0) * tau4 +
              SUN_RCONST(49.0) * tau3 + SUN_RCONST(13.0) * tau2);
      a[3] = h / FOUR *
             (SUN_RCONST(27.0) * tau5 + SUN_RCONST(72.0) * tau4 +
              SUN_RCONST(67.0) * tau3 + SUN_RCONST(26.0) * tau2 + FOUR * tau);
      a[4] = h / FOUR *
             (SUN_RCONST(81.0) * tau5 + SUN_RCONST(189.0) * tau4 +
              SUN_RCONST(135.0) * tau3 + SUN_RCONST(27.0) * tau2);
      a[5] = h / FOUR *
             (SUN_RCONST(81.0) * tau5 + SUN_RCONST(216.0) * tau4 +
              SUN_RCONST(189.0) * tau3 + SUN_RCONST(54.0) * tau2);
    }
    else if (d == 1)
    {
      a[0] = (SUN_RCONST(270.0) * tau4 + SUN_RCONST(540.0) * tau3 +
              SUN_RCONST(330.0) * tau2 + SUN_RCONST(60.0) * tau) /
             h;
      a[1] = -a[0];
      a[2] = (SUN_RCONST(135.0) * tau4 + SUN_RCONST(252.0) * tau3 +
              SUN_RCONST(147.0) * tau2 + SUN_RCONST(26.0) * tau) /
             FOUR;
      a[3] = (SUN_RCONST(135.0) * tau4 + SUN_RCONST(288.0) * tau3 +
              SUN_RCONST(201.0) * tau2 + SUN_RCONST(52.0) * tau + FOUR) /
             FOUR;
      a[4] = (SUN_RCONST(405.0) * tau4 + SUN_RCONST(4.0) * 189 * tau3 +
              SUN_RCONST(405.0) * tau2 + SUN_RCONST(54.0) * tau) /
             FOUR;
      a[5] = (SUN_RCONST(405.0) * tau4 + SUN_RCONST(864.0) * tau3 +
              SUN_RCONST(567.0) * tau2 + SUN_RCONST(108.0) * tau) /
             FOUR;
    }
    else if (d == 2)
    {
      a[0] = (SUN_RCONST(1080.0) * tau3 + SUN_RCONST(1620.0) * tau2 +
              SUN_RCONST(660.0) * tau + SUN_RCONST(60.0)) /
             h2;
      a[1] = -a[0];
      a[2] = (SUN_RCONST(270.0) * tau3 + SUN_RCONST(378.0) * tau2 +
              SUN_RCONST(147.0) * tau + SUN_RCONST(13.0)) /
             (TWO * h);
      a[3] = (SUN_RCONST(270.0) * tau3 + SUN_RCONST(432.0) * tau2 +
              SUN_RCONST(201.0) * tau + SUN_RCONST(26.0)) /
             (TWO * h);
      a[4] = (SUN_RCONST(810.0) * tau3 + SUN_RCONST(1134.0) * tau2 +
              SUN_RCONST(405.0) * tau + SUN_RCONST(27.0)) /
             (TWO * h);
      a[5] = (SUN_RCONST(810.0) * tau3 + SUN_RCONST(1296.0) * tau2 +
              SUN_RCONST(567.0) * tau + SUN_RCONST(54.0)) /
             (TWO * h);
    }
    else if (d == 3)
    {
      a[0] = (SUN_RCONST(3240.0) * tau2 + SUN_RCONST(3240.0) * tau +
              SUN_RCONST(660.0)) /
             h3;
      a[1] = -a[0];
      a[2] = (SUN_RCONST(810.0) * tau2 + SUN_RCONST(756.0) * tau +
              SUN_RCONST(147.0)) /
             (TWO * h2);
      a[3] = (SUN_RCONST(810.0) * tau2 + SUN_RCONST(864.0) * tau +
              SUN_RCONST(201.0)) /
             (TWO * h2);
      a[4] = (SUN_RCONST(2430.0) * tau2 + SUN_RCONST(2268.0) * tau +
              SUN_RCONST(405.0)) /
             (TWO * h2);
      a[5] = (SUN_RCONST(2430.0) * tau2 + SUN_RCONST(2592.0) * tau +
              SUN_RCONST(567.0)) /
             (TWO * h2);
    }
    else if (d == 4)
    {
      a[0] = (SUN_RCONST(6480.0) * tau + SUN_RCONST(3240.0)) / h4;
      a[1] = -a[0];
      a[2] = (SUN_RCONST(810.0) * tau + SUN_RCONST(378.0)) / h3;
      a[3] = (SUN_RCONST(810.0) * tau + SUN_RCONST(432.0)) / h3;
      a[4] = (SUN_RCONST(2430.0) * tau + SUN_RCONST(1134.0)) / h3;
      a[5] = (SUN_RCONST(2430.0) * tau + SUN_RCONST(1296.0)) / h3;
    }
    else
    { /* d == 5 */
      a[0] = SUN_RCONST(6480.0) / h5;
      a[1] = -a[0];
      a[2] = SUN_RCONST(810.0) / h4;
      a[3] = a[2];
      a[4] = SUN_RCONST(2430.0) / h4;
      a[5] = a[4];
    }
    X[0]   = HINT_YOLD(interp);
    X[1]   = ark_mem->yn;
    X[2]   = HINT_FOLD(interp);
    X[3]   = ark_mem->fn;
    X[4]   = HINT_FA(interp);
    X[5]   = HINT_FB(interp);
    retval = N_VLinearCombination(6, a, X, yout);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
    break;

  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Illegal polynomial order");
    return (ARK_ILL_INPUT);
  }

  return (ARK_SUCCESS);
}